

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

void __thiscall
CConnman::ThreadOpenConnections
          (CConnman *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          connect,Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  seed_nodes)

{
  CThreadInterrupt *this_00;
  ConnectionType CVar1;
  int iVar2;
  ServiceFlags SVar3;
  pointer pcVar4;
  CChainParams *pCVar5;
  byte *pbVar6;
  pointer ppCVar7;
  CNode *pCVar8;
  pointer pCVar9;
  AddrMan *pAVar10;
  double dVar11;
  long lVar12;
  undefined8 uVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  uint16_t port;
  Network NVar21;
  int iVar22;
  time_point tVar23;
  uint64_t uVar24;
  size_t sVar25;
  long lVar26;
  Logger *pLVar27;
  const_iterator cVar28;
  const_iterator cVar29;
  time_point tVar30;
  duration rel_time;
  microseconds mVar31;
  long in_RCX;
  char *pcVar32;
  ulong uVar33;
  pointer pCVar34;
  CAddress *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar35;
  void *__stat_loc;
  uint uVar36;
  ulong uVar37;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> tVar38;
  pointer pcVar39;
  long lVar40;
  pointer ppCVar41;
  bool bVar42;
  int iVar43;
  string *strDest;
  iterator __first;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  string_view logging_function_06;
  string_view logging_function_07;
  string_view logging_function_08;
  string_view logging_function_09;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view source_file_06;
  string_view source_file_07;
  string_view source_file_08;
  string_view source_file_09;
  Span<const_std::byte> sp;
  ConnectionType local_438;
  uint local_434;
  int local_400;
  long local_3e8;
  long local_3e0;
  long local_3d8;
  long local_3d0;
  duration local_3c0;
  char *local_348;
  undefined1 local_339;
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_338;
  unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
  reachable_nets;
  unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
  fixed_seed_networks;
  optional<Network> preferred_net;
  CSemaphoreGrant local_288;
  string local_278;
  vector<CAddress,_std::allocator<CAddress>_> seed_addrs;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock78;
  __native_type local_228;
  set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  outbound_ipv46_peer_netgroups;
  direct_or_indirect local_1c8;
  uint local_1b8;
  _Base_ptr local_1b0;
  ushort local_1a8;
  FastRandomContext rng;
  _Storage<Network,_true> local_118;
  undefined4 auStack_114 [3];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  direct_or_indirect local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  ushort local_d8;
  duration local_d0;
  __pthread_internal_list *p_Stack_c8;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock77;
  __native_type local_b0;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> local_88;
  long local_38;
  
  pbVar35 = seed_nodes.m_data;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  FastRandomContext::FastRandomContext(&rng,false);
  if ((pbVar35->_M_dataplus)._M_p == (pointer)pbVar35->_M_string_length) {
    tVar23 = NodeClock::now();
    lVar12 = (long)tVar23.__d.__r / 1000;
    uVar24 = FastRandomContext::rand64(&rng);
    dVar11 = MakeExponentiallyDistributed(uVar24);
    local_3d8 = (long)ROUND((float)(dVar11 * 120000000.0) + 0.5) + lVar12;
    uVar24 = FastRandomContext::rand64(&rng);
    dVar11 = MakeExponentiallyDistributed(uVar24);
    local_3d0 = (long)ROUND((float)(dVar11 * 300000000.0) + 0.5) + lVar12;
    uVar24 = FastRandomContext::rand64(&rng);
    dVar11 = MakeExponentiallyDistributed(uVar24);
    local_3e0 = (long)ROUND((float)(dVar11 * 300000000.0) + 0.5) + lVar12;
    criticalblock77.super_unique_lock._M_device = (mutex_type *)&local_b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&criticalblock77,"-dnsseed","");
    bVar14 = ArgsManager::GetBoolArg(&gArgs,(string *)&criticalblock77,true);
    if ((__native_type *)criticalblock77.super_unique_lock._M_device != &local_b0) {
      operator_delete(criticalblock77.super_unique_lock._M_device,
                      CONCAT44(local_b0.__data.__count,local_b0.__data.__lock) + 1);
    }
    criticalblock77.super_unique_lock._M_device = (mutex_type *)&local_b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&criticalblock77,"-fixedseeds","");
    bVar15 = ArgsManager::GetBoolArg(&gArgs,(string *)&criticalblock77,true);
    if ((__native_type *)criticalblock77.super_unique_lock._M_device != &local_b0) {
      operator_delete(criticalblock77.super_unique_lock._M_device,
                      CONCAT44(local_b0.__data.__count,local_b0.__data.__lock) + 1);
    }
    criticalblock77.super_unique_lock._M_device = (mutex_type *)&local_b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&criticalblock77,"-seednode","");
    bVar16 = ArgsManager::IsArgSet(&gArgs,(string *)&criticalblock77);
    if ((__native_type *)criticalblock77.super_unique_lock._M_device != &local_b0) {
      operator_delete(criticalblock77.super_unique_lock._M_device,
                      CONCAT44(local_b0.__data.__count,local_b0.__data.__lock) + 1);
    }
    local_3c0.__r = (rep)NodeClock::now();
    sVar25 = AddrMan::Size(this->addrman,(optional<Network>)0x0,(optional<bool>)0x0);
    if (!bVar15) {
      logging_function._M_str = "ThreadOpenConnections";
      logging_function._M_len = 0x15;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
      ;
      source_file._M_len = 0x57;
      LogPrintFormatInternal<>
                (logging_function,source_file,0x9c2,ALL,Info,(ConstevalFormatString<0U>)0x7d25e2);
    }
    bVar42 = sVar25 == 0 && in_RCX != 0;
    this_00 = &this->interruptNet;
    local_3e8 = in_RCX;
    do {
      bVar17 = CThreadInterrupt::operator_cast_to_bool(this_00);
      if (bVar17) break;
      if (bVar42) {
        local_3e8 = local_3e8 + -1;
        strDest = (string *)(local_3e8 * 0x20 + seed_nodes.m_size);
        AddAddrFetch(this,strDest);
        sVar25 = AddrMan::Size(this->addrman,(optional<Network>)0x0,(optional<bool>)0x0);
        if (sVar25 == 0) {
          logging_function_01._M_str = "ThreadOpenConnections";
          logging_function_01._M_len = 0x15;
          source_file_01._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
          ;
          source_file_01._M_len = 0x57;
          LogPrintFormatInternal<std::__cxx11::string>
                    (logging_function_01,source_file_01,0x9cd,ALL,Info,
                     (ConstevalFormatString<1U>)0x7d25fc,strDest);
        }
        else {
          criticalblock77.super_unique_lock._M_device = (mutex_type *)0xa;
          logging_function_00._M_str = "ThreadOpenConnections";
          logging_function_00._M_len = 0x15;
          source_file_00._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
          ;
          source_file_00._M_len = 0x57;
          LogPrintFormatInternal<long,std::__cxx11::string>
                    (logging_function_00,source_file_00,0x9cf,ALL,Info,
                     (ConstevalFormatString<2U>)0x7d262e,(long *)&criticalblock77,strDest);
        }
      }
      ProcessAddrFetch(this);
      __stat_loc = (void *)0x1dcd6500;
      bVar42 = CThreadInterrupt::sleep_for(this_00,(duration)0x1dcd6500);
      if (!bVar42) break;
      PerformReconnections(this);
      local_288.sem =
           (this->semOutbound)._M_t.
           super___uniq_ptr_impl<CSemaphore,_std::default_delete<CSemaphore>_>._M_t.
           super__Tuple_impl<0UL,_CSemaphore_*,_std::default_delete<CSemaphore>_>.
           super__Head_base<0UL,_CSemaphore_*,_false>._M_head_impl;
      CSemaphore::wait(local_288.sem,__stat_loc);
      local_288.fHaveGrant = true;
      bVar42 = CThreadInterrupt::operator_cast_to_bool(this_00);
      if (bVar42) {
        iVar22 = 1;
        bVar42 = false;
      }
      else {
        GetReachableEmptyNetworks(&fixed_seed_networks,this);
        if ((fixed_seed_networks._M_h._M_element_count != 0 & bVar15) == 1) {
          tVar23 = NodeClock::now();
          lVar26 = ((long)tVar23.__d.__r / 1000000000) * 1000000;
          if (lVar26 - (lVar12 + 60000000) == 0 || lVar26 < lVar12 + 60000000) {
            bVar15 = true;
            if (!bVar14 && !bVar16) {
              criticalblock77.super_unique_lock._M_owns = false;
              criticalblock77.super_unique_lock._M_device = &(this->m_added_nodes_mutex).super_mutex
              ;
              std::unique_lock<std::mutex>::lock(&criticalblock77.super_unique_lock);
              if ((this->m_added_node_params).
                  super__Vector_base<AddedNodeParams,_std::allocator<AddedNodeParams>_>._M_impl.
                  super__Vector_impl_data._M_start ==
                  (this->m_added_node_params).
                  super__Vector_base<AddedNodeParams,_std::allocator<AddedNodeParams>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                logging_function_04._M_str = "ThreadOpenConnections";
                logging_function_04._M_len = 0x15;
                source_file_04._M_str =
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
                ;
                source_file_04._M_len = 0x57;
                pcVar32 = 
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
                ;
                LogPrintFormatInternal<>
                          (logging_function_04,source_file_04,0x9f0,ALL,Info,
                           (ConstevalFormatString<0U>)0x7d26f0);
                std::unique_lock<std::mutex>::~unique_lock(&criticalblock77.super_unique_lock);
                goto LAB_001a688c;
              }
              std::unique_lock<std::mutex>::~unique_lock(&criticalblock77.super_unique_lock);
            }
          }
          else {
            logging_function_02._M_str = "ThreadOpenConnections";
            logging_function_02._M_len = 0x15;
            source_file_02._M_str =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
            ;
            source_file_02._M_len = 0x57;
            pcVar32 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
            ;
            LogPrintFormatInternal<>
                      (logging_function_02,source_file_02,0x9e8,ALL,Info,
                       (ConstevalFormatString<0U>)0x7d268a);
LAB_001a688c:
            pCVar5 = this->m_params;
            seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            FastRandomContext::FastRandomContext((FastRandomContext *)&criticalblock77,false);
            pbVar6 = (pCVar5->vFixedSeeds).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            sp.m_size = (long)(pCVar5->vFixedSeeds).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)pbVar6;
            sp.m_data = pbVar6;
            DataStream::DataStream((DataStream *)&local_f8.indirect_contents,sp);
            reachable_nets._M_h._M_buckets = (__buckets_ptr)&CAddress::V2_NETWORK;
            reachable_nets._M_h._M_bucket_count = (size_type)local_f8.indirect_contents.indirect;
            reachable_nets._M_h._M_before_begin._M_nxt = (_Hash_node_base *)local_f8._8_8_;
            reachable_nets._M_h._M_element_count = local_e8._M_allocated_capacity;
            reachable_nets._M_h._M_rehash_policy._0_8_ = local_e8._8_8_;
            local_f8.indirect_contents.indirect = (char *)0x0;
            local_f8._8_8_ = (_Hash_node_base *)0x0;
            local_e8._M_allocated_capacity = 0;
            std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                      ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)
                       &local_f8.indirect_contents);
            while ((_Hash_node_base *)
                   (reachable_nets._M_h._M_rehash_policy._0_8_ + reachable_nets._M_h._M_bucket_count
                   ) != reachable_nets._M_h._M_before_begin._M_nxt) {
              CService::CService((CService *)&criticalblock78);
              CNetAddr::Unserialize<ParamsStream<DataStream,CAddress::SerParams>>
                        ((CNetAddr *)&criticalblock78,
                         (ParamsStream<DataStream,_CAddress::SerParams> *)&reachable_nets);
              local_f8.indirect_contents.indirect = (char *)0x0;
              DataStream::read((DataStream *)&reachable_nets._M_h._M_bucket_count,(int)&local_f8 + 6
                               ,(void *)0x2,(size_t)pcVar32);
              local_228.__data.__kind._0_2_ =
                   (ushort)(byte)((ulong)local_f8._0_8_ >> 0x38) |
                   (ushort)((ulong)local_f8._0_8_ >> 0x28) & 0xff00;
              prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                        ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                         &outbound_ipv46_peer_netgroups,
                         (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&criticalblock78);
              outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   (_Base_ptr)local_228._8_8_;
              outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   (_Base_ptr)
                   CONCAT62(outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header.
                            _M_header._M_right._2_6_,local_228.__data.__kind._0_2_);
              prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                        ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                         &local_f8.indirect_contents,
                         (prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                         &outbound_ipv46_peer_netgroups);
              local_e8._8_8_ =
                   outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header._M_header.
                   _M_left;
              local_d8 = (ushort)outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header.
                                 _M_header._M_right;
              local_d0.__r = 100000000;
              p_Stack_c8 = (__pthread_internal_list *)0x9;
              if (0x10 < (uint)outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header.
                               _M_header._M_parent) {
                free((void *)outbound_ipv46_peer_netgroups._M_t._M_impl._0_8_);
                outbound_ipv46_peer_netgroups._M_t._M_impl._0_8_ = 0;
              }
              tVar23 = NodeClock::now();
              pcVar32 = (char *)0x112e0be826d694b3;
              do {
                uVar24 = RandomMixin<FastRandomContext>::randbits
                                   ((RandomMixin<FastRandomContext> *)&criticalblock77,0x14);
              } while (0x93a7f < uVar24);
              local_d0.__r = ((long)tVar23.__d.__r / 1000000000 - uVar24) + -0x93a80;
              pLVar27 = LogInstance();
              bVar15 = BCLog::Logger::WillLogCategoryLevel(pLVar27,NET,Debug);
              if (bVar15) {
                CService::ToStringAddrPort_abi_cxx11_
                          ((string *)&local_118,(CService *)&local_f8.indirect_contents);
                logging_function_03._M_str = "ConvertSeeds";
                logging_function_03._M_len = 0xc;
                source_file_03._M_str =
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
                ;
                source_file_03._M_len = 0x57;
                pcVar32 = 
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
                ;
                LogPrintFormatInternal<std::__cxx11::string>
                          (logging_function_03,source_file_03,0xcf,NET,Debug,
                           (ConstevalFormatString<1U>)0x7d3061,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_118);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(auStack_114[0],local_118._M_value) != &local_108) {
                  operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)CONCAT44(auStack_114[0],local_118._M_value),
                                  local_108._M_allocated_capacity + 1);
                }
              }
              std::vector<CAddress,_std::allocator<CAddress>_>::push_back
                        (&seed_addrs,(value_type *)&local_f8.indirect_contents);
              if (0x10 < (uint)local_e8._M_allocated_capacity._0_4_) {
                free(local_f8.indirect_contents.indirect);
              }
              if (0x10 < (uint)local_228.__data.__lock) {
                free(criticalblock78.super_unique_lock._M_device);
              }
            }
            std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                      ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)
                       &reachable_nets._M_h._M_bucket_count);
            ChaCha20::~ChaCha20((ChaCha20 *)&local_b0.__data);
            pCVar9 = seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            lVar40 = (long)seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>.
                           _M_impl.super__Vector_impl_data._M_start;
            lVar26 = (lVar40 >> 3) * 0x6db6db6db6db6db7 >> 2;
            pCVar34 = seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if (0 < lVar26) {
              lVar26 = lVar26 + 1;
              do {
                NVar21 = CNetAddr::GetNetwork((CNetAddr *)pCVar34);
                criticalblock77.super_unique_lock._M_device =
                     (mutex_type *)
                     CONCAT44(criticalblock77.super_unique_lock._M_device._4_4_,NVar21);
                cVar28 = std::
                         _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         ::find(&fixed_seed_networks._M_h,(key_type *)&criticalblock77);
                __first._M_current = pCVar34;
                if (cVar28.super__Node_iterator_base<Network,_false>._M_cur == (__node_type *)0x0)
                goto LAB_001a6e0a;
                NVar21 = CNetAddr::GetNetwork((CNetAddr *)(pCVar34 + 1));
                criticalblock77.super_unique_lock._M_device =
                     (mutex_type *)
                     CONCAT44(criticalblock77.super_unique_lock._M_device._4_4_,NVar21);
                cVar28 = std::
                         _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         ::find(&fixed_seed_networks._M_h,(key_type *)&criticalblock77);
                __first._M_current = pCVar34 + 1;
                if (cVar28.super__Node_iterator_base<Network,_false>._M_cur == (__node_type *)0x0)
                goto LAB_001a6e0a;
                NVar21 = CNetAddr::GetNetwork((CNetAddr *)(pCVar34 + 2));
                criticalblock77.super_unique_lock._M_device =
                     (mutex_type *)
                     CONCAT44(criticalblock77.super_unique_lock._M_device._4_4_,NVar21);
                cVar28 = std::
                         _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         ::find(&fixed_seed_networks._M_h,(key_type *)&criticalblock77);
                __first._M_current = pCVar34 + 2;
                if (cVar28.super__Node_iterator_base<Network,_false>._M_cur == (__node_type *)0x0)
                goto LAB_001a6e0a;
                NVar21 = CNetAddr::GetNetwork((CNetAddr *)(pCVar34 + 3));
                criticalblock77.super_unique_lock._M_device =
                     (mutex_type *)
                     CONCAT44(criticalblock77.super_unique_lock._M_device._4_4_,NVar21);
                cVar28 = std::
                         _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         ::find(&fixed_seed_networks._M_h,(key_type *)&criticalblock77);
                __first._M_current = pCVar34 + 3;
                if (cVar28.super__Node_iterator_base<Network,_false>._M_cur == (__node_type *)0x0)
                goto LAB_001a6e0a;
                pCVar34 = pCVar34 + 4;
                lVar26 = lVar26 + -1;
                lVar40 = lVar40 + -0xe0;
              } while (1 < lVar26);
            }
            lVar26 = (lVar40 >> 3) * 0x6db6db6db6db6db7;
            if (lVar26 == 1) {
LAB_001a6d2a:
              NVar21 = CNetAddr::GetNetwork((CNetAddr *)pCVar34);
              criticalblock77.super_unique_lock._M_device =
                   (mutex_type *)CONCAT44(criticalblock77.super_unique_lock._M_device._4_4_,NVar21);
              cVar28 = std::
                       _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       ::find(&fixed_seed_networks._M_h,(key_type *)&criticalblock77);
              __first._M_current = pCVar34;
              if (cVar28.super__Node_iterator_base<Network,_false>._M_cur != (__node_type *)0x0) {
                __first._M_current = pCVar9;
              }
LAB_001a6e0a:
              this_01 = __first._M_current + 1;
              if (this_01 != pCVar9 && __first._M_current != pCVar9) {
                do {
                  NVar21 = CNetAddr::GetNetwork((CNetAddr *)this_01);
                  criticalblock77.super_unique_lock._M_device =
                       (mutex_type *)
                       CONCAT44(criticalblock77.super_unique_lock._M_device._4_4_,NVar21);
                  cVar28 = std::
                           _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           ::find(&fixed_seed_networks._M_h,(key_type *)&criticalblock77);
                  if (cVar28.super__Node_iterator_base<Network,_false>._M_cur != (__node_type *)0x0)
                  {
                    if (0x10 < *(uint *)((direct_or_indirect *)
                                         &((__first._M_current)->super_CService).super_CNetAddr + 1)
                       ) {
                      free((((direct_or_indirect *)
                            &((__first._M_current)->super_CService).super_CNetAddr)->
                           indirect_contents).indirect);
                    }
                    uVar13 = *(undefined8 *)((long)&(this_01->super_CService).super_CNetAddr + 8);
                    (((direct_or_indirect *)&((__first._M_current)->super_CService).super_CNetAddr)
                    ->indirect_contents).indirect =
                         (((direct_or_indirect *)&(this_01->super_CService).super_CNetAddr)->
                         indirect_contents).indirect;
                    *(undefined8 *)
                     ((long)&((__first._M_current)->super_CService).super_CNetAddr + 8) = uVar13;
                    *(size_type *)
                     ((direct_or_indirect *)&((__first._M_current)->super_CService).super_CNetAddr +
                     1) = *(size_type *)
                           ((direct_or_indirect *)&(this_01->super_CService).super_CNetAddr + 1);
                    *(size_type *)
                     ((direct_or_indirect *)&(this_01->super_CService).super_CNetAddr + 1) = 0;
                    *(undefined8 *)
                     (((direct_or_indirect *)&((__first._M_current)->super_CService).super_CNetAddr)
                      ->direct + 0x18) =
                         *(undefined8 *)
                          (((direct_or_indirect *)&(this_01->super_CService).super_CNetAddr)->direct
                          + 0x18);
                    ((__first._M_current)->super_CService).port = (this_01->super_CService).port;
                    SVar3 = this_01->nServices;
                    ((__first._M_current)->nTime).__d.__r = (this_01->nTime).__d.__r;
                    (__first._M_current)->nServices = SVar3;
                    __first._M_current = __first._M_current + 1;
                  }
                  this_01 = this_01 + 1;
                } while (this_01 != pCVar9);
              }
            }
            else {
              if (lVar26 == 2) {
LAB_001a6cfd:
                NVar21 = CNetAddr::GetNetwork((CNetAddr *)pCVar34);
                criticalblock77.super_unique_lock._M_device =
                     (mutex_type *)
                     CONCAT44(criticalblock77.super_unique_lock._M_device._4_4_,NVar21);
                cVar28 = std::
                         _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         ::find(&fixed_seed_networks._M_h,(key_type *)&criticalblock77);
                __first._M_current = pCVar34;
                if (cVar28.super__Node_iterator_base<Network,_false>._M_cur != (__node_type *)0x0) {
                  pCVar34 = pCVar34 + 1;
                  goto LAB_001a6d2a;
                }
                goto LAB_001a6e0a;
              }
              __first._M_current = pCVar9;
              if (lVar26 == 3) {
                NVar21 = CNetAddr::GetNetwork((CNetAddr *)pCVar34);
                criticalblock77.super_unique_lock._M_device =
                     (mutex_type *)
                     CONCAT44(criticalblock77.super_unique_lock._M_device._4_4_,NVar21);
                cVar28 = std::
                         _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         ::find(&fixed_seed_networks._M_h,(key_type *)&criticalblock77);
                __first._M_current = pCVar34;
                if (cVar28.super__Node_iterator_base<Network,_false>._M_cur != (__node_type *)0x0) {
                  pCVar34 = pCVar34 + 1;
                  goto LAB_001a6cfd;
                }
                goto LAB_001a6e0a;
              }
            }
            std::vector<CAddress,_std::allocator<CAddress>_>::_M_erase
                      (&seed_addrs,__first,
                       (iterator)
                       seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                       super__Vector_impl_data._M_finish);
            CNetAddr::CNetAddr((CNetAddr *)&criticalblock77);
            local_f8.indirect_contents.indirect = (char *)&local_e8;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"fixedseeds","");
            CNetAddr::SetInternal
                      ((CNetAddr *)&criticalblock77,(string *)&local_f8.indirect_contents);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8.indirect_contents.indirect != &local_e8) {
              operator_delete(local_f8.indirect_contents.indirect,local_e8._M_allocated_capacity + 1
                             );
            }
            AddrMan::Add(this->addrman,&seed_addrs,(CNetAddr *)&criticalblock77,(seconds)0x0);
            local_f8.indirect_contents.indirect =
                 (char *)(((long)seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7
                         );
            logging_function_05._M_str = "ThreadOpenConnections";
            logging_function_05._M_len = 0x15;
            source_file_05._M_str =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
            ;
            source_file_05._M_len = 0x57;
            LogPrintFormatInternal<unsigned_long>
                      (logging_function_05,source_file_05,0xa03,ALL,Info,
                       (ConstevalFormatString<1U>)0x7d2777,(unsigned_long *)local_f8.direct);
            if (0x10 < (uint)local_b0.__data.__lock) {
              free(criticalblock77.super_unique_lock._M_device);
            }
            std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&seed_addrs);
            bVar15 = false;
          }
        }
        CService::CService((CService *)&local_f8.indirect_contents);
        local_d0.__r = 100000000;
        p_Stack_c8 = (__pthread_internal_list *)0x0;
        outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red
        ;
        outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header._M_header;
        outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        criticalblock78.super_unique_lock._8_8_ =
             criticalblock78.super_unique_lock._8_8_ & 0xffffffffffffff00;
        criticalblock78.super_unique_lock._M_device = &(this->m_nodes_mutex).super_recursive_mutex;
        outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        std::unique_lock<std::recursive_mutex>::lock(&criticalblock78.super_unique_lock);
        ppCVar41 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        ppCVar7 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if (ppCVar41 == ppCVar7) {
          local_400 = 0;
          iVar43 = 0;
          uVar36 = 0;
        }
        else {
          uVar36 = 0;
          iVar43 = 0;
          local_400 = 0;
          do {
            pCVar8 = *ppCVar41;
            CVar1 = pCVar8->m_conn_type;
            if ((CVar1 < ADDR_FETCH) && ((0x16U >> (CVar1 & 0x1f) & 1) != 0)) {
              prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                        ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&criticalblock77,
                         (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&pCVar8->addr);
              local_b0._8_8_ = *(undefined8 *)&(pCVar8->addr).super_CService.super_CNetAddr.m_net;
              local_b0.__data.__kind._0_2_ = (pCVar8->addr).super_CService.port;
              local_b0.__data.__list.__prev =
                   (__pthread_internal_list *)(pCVar8->addr).nTime.__d.__r;
              local_b0.__data.__list.__next = (__pthread_internal_list *)(pCVar8->addr).nServices;
              if ((int)(float)local_b0._8_8_ - 3U < 3) {
                local_400 = local_400 + 1;
              }
              else {
                NetGroupManager::GetGroup
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&reachable_nets,
                           this->m_netgroupman,(CNetAddr *)&criticalblock77);
                std::
                _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ::_M_insert_unique<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          ((_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                            *)&outbound_ipv46_peer_netgroups,
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&reachable_nets)
                ;
                if (reachable_nets._M_h._M_buckets != (__buckets_ptr)0x0) {
                  operator_delete(reachable_nets._M_h._M_buckets,
                                  (long)reachable_nets._M_h._M_before_begin._M_nxt -
                                  (long)reachable_nets._M_h._M_buckets);
                }
              }
              if (0x10 < (uint)local_b0.__data.__lock) {
                free(criticalblock77.super_unique_lock._M_device);
              }
            }
            uVar36 = uVar36 + (CVar1 == OUTBOUND_FULL_RELAY);
            iVar43 = iVar43 + (uint)(CVar1 == BLOCK_RELAY);
            ppCVar41 = ppCVar41 + 1;
          } while (ppCVar41 != ppCVar7);
        }
        std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock78.super_unique_lock);
        bVar42 = false;
        if ((local_3e8 != 0) && (uVar36 < 2)) {
          tVar23 = NodeClock::now();
          if (local_3c0.__r + 10000000000 < (long)tVar23.__d.__r) {
            bVar42 = true;
            local_3c0.__r = (rep)NodeClock::now();
          }
          else {
            bVar42 = false;
          }
        }
        tVar23 = NodeClock::now();
        preferred_net.super__Optional_base<Network,_true,_true>._M_payload.
        super__Optional_payload_base<Network>._M_engaged = false;
        bVar17 = (this->m_anchors).super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                 super__Vector_impl_data._M_start ==
                 (this->m_anchors).super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        iVar2 = this->m_max_outbound_block_relay;
        if (iVar2 > iVar43 && !bVar17) {
LAB_001a724e:
          local_438 = BLOCK_RELAY;
          bVar20 = false;
          goto LAB_001a727d;
        }
        if ((int)uVar36 < this->m_max_outbound_full_relay) {
LAB_001a7265:
          bVar20 = false;
          local_438 = OUTBOUND_FULL_RELAY;
          goto LAB_001a727d;
        }
        local_438 = BLOCK_RELAY;
        if (iVar43 < iVar2) goto LAB_001a724e;
        if (((this->m_try_another_outbound_peer)._M_base._M_i & 1U) != 0) goto LAB_001a7265;
        lVar26 = (long)tVar23.__d.__r / 1000;
        if ((local_3d0 < lVar26) &&
           (((this->m_start_extra_block_relay_peers)._M_base._M_i & 1U) != 0)) {
          uVar24 = FastRandomContext::rand64(&rng);
          dVar11 = MakeExponentiallyDistributed(uVar24);
          local_3d0 = lVar26 + (long)ROUND(dVar11 * 300000000.0 + 0.5);
          bVar20 = false;
LAB_001a727d:
          AddrMan::ResolveCollisions(this->addrman);
          tVar23 = NodeClock::now();
          ReachableNets::All(&reachable_nets,&g_reachable_nets);
          local_434 = 0;
          do {
            while( true ) {
              bVar18 = CThreadInterrupt::operator_cast_to_bool(this_00);
              if (bVar18) goto LAB_001a7bde;
              if ((iVar2 <= iVar43 || bVar17) ||
                 (pCVar9 = (this->m_anchors).super__Vector_base<CAddress,_std::allocator<CAddress>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
                 (this->m_anchors).super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                 super__Vector_impl_data._M_start == pCVar9)) break;
              prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                        ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&criticalblock77,
                         (prevector<16U,_unsigned_char,_unsigned_int,_int> *)(pCVar9 + -1));
              local_b0._8_8_ = *(undefined8 *)&pCVar9[-1].super_CService.super_CNetAddr.m_net;
              local_b0.__data.__kind._0_2_ = pCVar9[-1].super_CService.port;
              local_b0.__data.__list.__prev = (__pthread_internal_list *)pCVar9[-1].nTime.__d.__r;
              local_b0.__data.__list.__next = (__pthread_internal_list *)pCVar9[-1].nServices;
              pCVar34 = (this->m_anchors).super__Vector_base<CAddress,_std::allocator<CAddress>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
              pCVar9 = pCVar34 + -1;
              (this->m_anchors).super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
              super__Vector_impl_data._M_finish = pCVar9;
              if (0x10 < pCVar34[-1].super_CService.super_CNetAddr.m_addr._size) {
                free((pCVar9->super_CService).super_CNetAddr.m_addr._union.indirect_contents.
                     indirect);
                (pCVar9->super_CService).super_CNetAddr.m_addr._union.indirect_contents.indirect =
                     (char *)0x0;
              }
              bVar19 = CNetAddr::IsValid((CNetAddr *)&criticalblock77);
              bVar18 = true;
              if ((bVar19) && (bVar19 = IsLocal((CService *)&criticalblock77), !bVar19)) {
                NVar21 = CNetAddr::GetNetwork((CNetAddr *)&criticalblock77);
                bVar19 = ReachableNets::Contains(&g_reachable_nets,NVar21);
                if ((bVar19) &&
                   (iVar22 = (*this->m_msgproc->_vptr_NetEventsInterface[2])
                                       (this->m_msgproc,local_b0.__data.__list.__next),
                   (char)iVar22 != '\0')) {
                  NetGroupManager::GetGroup
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             &criticalblock78,this->m_netgroupman,(CNetAddr *)&criticalblock77);
                  cVar29 = std::
                           _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::_Identity<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           ::find(&outbound_ipv46_peer_netgroups._M_t,(key_type *)&criticalblock78);
                  if (criticalblock78.super_unique_lock._M_device != (mutex_type *)0x0) {
                    operator_delete(criticalblock78.super_unique_lock._M_device,
                                    CONCAT44(local_228.__data.__count,local_228.__data.__lock) -
                                    (long)criticalblock78.super_unique_lock._M_device);
                  }
                  if ((_Rb_tree_header *)cVar29._M_node ==
                      &outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header) {
                    prevector<16U,_unsigned_char,_unsigned_int,_int>::operator=
                              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                               &local_f8.indirect_contents,
                               (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&criticalblock77)
                    ;
                    local_e8._8_8_ = local_b0._8_8_;
                    local_d8 = local_b0.__data.__kind._0_2_;
                    local_d0.__r = (rep)local_b0.__data.__list.__prev;
                    p_Stack_c8 = local_b0.__data.__list.__next;
                    pLVar27 = LogInstance();
                    bVar18 = BCLog::Logger::WillLogCategoryLevel(pLVar27,NET,Debug);
                    if (bVar18) {
                      CService::ToStringAddrPort_abi_cxx11_
                                ((string *)&criticalblock78,(CService *)&local_f8.indirect_contents)
                      ;
                      logging_function_06._M_str = "ThreadOpenConnections";
                      logging_function_06._M_len = 0x15;
                      source_file_06._M_str =
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
                      ;
                      source_file_06._M_len = 0x57;
                      LogPrintFormatInternal<std::__cxx11::string>
                                (logging_function_06,source_file_06,0xa93,NET,Debug,
                                 (ConstevalFormatString<1U>)0x7d27a6,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&criticalblock78);
                      if ((__native_type *)criticalblock78.super_unique_lock._M_device != &local_228
                         ) {
                        operator_delete(criticalblock78.super_unique_lock._M_device,
                                        CONCAT44(local_228.__data.__count,local_228.__data.__lock) +
                                        1);
                      }
                    }
                    bVar18 = false;
                  }
                }
              }
              if (0x10 < (uint)local_b0.__data.__lock) {
                free(criticalblock77.super_unique_lock._M_device);
              }
              if (!bVar18) goto LAB_001a7bde;
            }
            if (local_434 == 100) break;
            CService::CService((CService *)&criticalblock78);
            bVar18 = preferred_net.super__Optional_base<Network,_true,_true>._M_payload.
                     super__Optional_payload_base<Network>._M_engaged;
            local_228.__data.__list.__prev = (__pthread_internal_list *)0x5f5e100;
            local_228.__data.__list.__next = (__pthread_internal_list *)0x0;
            if (bVar20) {
              AddrMan::SelectTriedCollision
                        ((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                          *)&criticalblock77,this->addrman);
              if (0x10 < (uint)local_228.__data.__lock) {
                free(criticalblock78.super_unique_lock._M_device);
              }
              tVar38.__d.__r = local_88.__d.__r;
              criticalblock78.super_unique_lock._9_7_ = criticalblock77.super_unique_lock._9_7_;
              criticalblock78.super_unique_lock._M_owns = criticalblock77.super_unique_lock._M_owns;
              criticalblock78.super_unique_lock._M_device =
                   (mutex_type *)criticalblock77.super_unique_lock._M_device;
              local_228.__data.__lock = local_b0.__data.__lock;
              local_b0.__data.__lock = 0;
              local_228._8_8_ = local_b0._8_8_;
              local_228.__data.__kind._0_2_ = local_b0.__data.__kind._0_2_;
              local_228.__data.__list.__prev = local_b0.__data.__list.__prev;
              local_228.__data.__list.__next = local_b0.__data.__list.__next;
              bVar18 = CNetAddr::IsValid((CNetAddr *)&criticalblock78);
              if (bVar18) {
                bVar18 = AlreadyConnectedToAddress(this,(CAddress *)&criticalblock78);
                if (!bVar18) goto LAB_001a7893;
                pAVar10 = this->addrman;
                tVar30 = NodeClock::now();
                AddrMan::Good(pAVar10,(CService *)&criticalblock78,
                              (NodeSeconds)((long)tVar30.__d.__r / 1000000000));
                AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                                 *)&criticalblock77,this->addrman,true,&reachable_nets);
              }
              else {
                AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                                 *)&criticalblock77,this->addrman,true,&reachable_nets);
              }
              if (0x10 < (uint)local_228.__data.__lock) {
                free(criticalblock78.super_unique_lock._M_device);
              }
              criticalblock78.super_unique_lock._9_7_ = criticalblock77.super_unique_lock._9_7_;
              criticalblock78.super_unique_lock._M_owns = criticalblock77.super_unique_lock._M_owns;
              criticalblock78.super_unique_lock._M_device =
                   (mutex_type *)criticalblock77.super_unique_lock._M_device;
              local_228.__data.__lock = local_b0.__data.__lock;
              local_b0.__data.__lock = 0;
              local_228._8_8_ = local_b0._8_8_;
              local_228.__data.__kind._0_2_ = local_b0.__data.__kind._0_2_;
              local_228.__data.__list.__prev = local_b0.__data.__list.__prev;
              local_228.__data.__list.__next = local_b0.__data.__list.__next;
              tVar38.__d.__r = local_88.__d.__r;
LAB_001a7893:
              bVar18 = CNetAddr::IsValid((CNetAddr *)&criticalblock78);
              if ((!bVar18) || (bVar18 = IsLocal((CService *)&criticalblock78), bVar18)) {
LAB_001a78b5:
                bVar18 = false;
              }
              else {
                NVar21 = CNetAddr::GetNetwork((CNetAddr *)&criticalblock78);
                bVar19 = ReachableNets::Contains(&g_reachable_nets,NVar21);
                bVar18 = true;
                if ((bVar19) &&
                   (599999999999 < (long)tVar38.__d.__r * -1000000000 + (long)tVar23.__d.__r ||
                    0x1c < local_434)) {
                  if (bVar20) {
                    if (((ulong)local_228.__data.__list.__next & (NODE_NETWORK_LIMITED|NODE_NETWORK)
                        ) != NODE_NONE) {
LAB_001a796b:
                      if ((local_434 < 0x31) && (local_228.__data.__owner - 1U < 2)) {
                        port = CService::GetPort((CService *)&criticalblock78);
                        bVar19 = IsBadPort(port);
                        if (bVar19) goto LAB_001a78b7;
                      }
                      bVar19 = AddedNodesContain(this,(CAddress *)&criticalblock78);
                      if (!bVar19) {
                        prevector<16U,_unsigned_char,_unsigned_int,_int>::operator=
                                  ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                                   &local_f8.indirect_contents,
                                   (prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                                   &criticalblock78);
                        local_e8._8_8_ = local_228._8_8_;
                        local_d8 = local_228.__data.__kind._0_2_;
                        local_d0.__r = (rep)local_228.__data.__list.__prev;
                        p_Stack_c8 = local_228.__data.__list.__next;
                        goto LAB_001a78b5;
                      }
                      pLVar27 = LogInstance();
                      bVar19 = BCLog::Logger::WillLogCategoryLevel(pLVar27,NET,Debug);
                      if (bVar19) {
                        local_348 = "";
                        pcVar32 = "network-specific ";
                        if (preferred_net.super__Optional_base<Network,_true,_true>._M_payload.
                            super__Optional_payload_base<Network>._M_engaged != false) {
                          local_348 = "network-specific ";
                        }
                        ConnectionTypeAsString_abi_cxx11_((string *)&criticalblock77,local_438);
                        NVar21 = CNetAddr::GetNetwork((CNetAddr *)&criticalblock78);
                        GetNetworkName_abi_cxx11_((string *)&local_118,NVar21);
                        bVar19 = fLogIPs;
                        if (fLogIPs == true) {
                          CService::ToStringAddrPort_abi_cxx11_
                                    (&local_278,(CService *)&criticalblock78);
                          tinyformat::format<std::__cxx11::string>
                                    ((string *)&seed_addrs,(tinyformat *)0x7d010b,(char *)&local_278
                                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)pcVar32);
                        }
                        else {
                          seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl
                          .super__Vector_impl_data._M_start =
                               (pointer)&seed_addrs.
                                         super__Vector_base<CAddress,_std::allocator<CAddress>_>.
                                         _M_impl.super__Vector_impl_data._M_end_of_storage;
                          std::__cxx11::string::_M_construct<char_const*>((string *)&seed_addrs,"");
                        }
                        logging_function_07._M_str = "ThreadOpenConnections";
                        logging_function_07._M_len = 0x15;
                        source_file_07._M_str =
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
                        ;
                        source_file_07._M_len = 0x57;
                        LogPrintFormatInternal<char_const*,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                                  (logging_function_07,source_file_07,0xae6,NET,Debug,
                                   (ConstevalFormatString<4U>)0x7d27d1,&local_348,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&criticalblock77,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&local_118,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&seed_addrs);
                        if (seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>.
                            _M_impl.super__Vector_impl_data._M_start !=
                            (pointer)&seed_addrs.
                                      super__Vector_base<CAddress,_std::allocator<CAddress>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                          operator_delete(seed_addrs.
                                          super__Vector_base<CAddress,_std::allocator<CAddress>_>.
                                          _M_impl.super__Vector_impl_data._M_start,
                                          (ulong)((long)&((seed_addrs.
                                                                                                                      
                                                  super__Vector_base<CAddress,_std::allocator<CAddress>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->super_CService).super_CNetAddr.m_addr._union +
                                                 1));
                        }
                        bVar18 = true;
                        if ((bVar19 != false) &&
                           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_278._M_dataplus._M_p != &local_278.field_2)) {
                          operator_delete(local_278._M_dataplus._M_p,
                                          local_278.field_2._M_allocated_capacity + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(auStack_114[0],local_118._M_value) != &local_108) {
                          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)CONCAT44(auStack_114[0],local_118._M_value),
                                          local_108._M_allocated_capacity + 1);
                        }
                        if ((__native_type *)criticalblock77.super_unique_lock._M_device !=
                            &local_b0) {
                          operator_delete(criticalblock77.super_unique_lock._M_device,
                                          CONCAT44(local_b0.__data.__count,local_b0.__data.__lock) +
                                          1);
                        }
                      }
                    }
                  }
                  else {
                    iVar22 = (*this->m_msgproc->_vptr_NetEventsInterface[2])
                                       (this->m_msgproc,local_228.__data.__list.__next);
                    if ((char)iVar22 != '\0') goto LAB_001a796b;
                  }
                }
              }
            }
            else {
              pAVar10 = this->addrman;
              if (preferred_net.super__Optional_base<Network,_true,_true>._M_payload.
                  super__Optional_payload_base<Network>._M_engaged == true) {
                local_118 = preferred_net.super__Optional_base<Network,_true,_true>._M_payload.
                            super__Optional_payload_base<Network>._M_payload;
                std::
                _Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                ::_Hashtable<Network_const*>
                          ((_Hashtable<Network,Network,std::allocator<Network>,std::__detail::_Identity,std::equal_to<Network>,std::hash<Network>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                            *)&local_338,&local_118,auStack_114,0,&seed_addrs,&local_348,&local_339)
                ;
                AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                                 *)&criticalblock77,pAVar10,false,
                                (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                                 *)&local_338);
              }
              else {
                AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                                 *)&criticalblock77,pAVar10,false,&reachable_nets);
              }
              if (0x10 < (uint)local_228.__data.__lock) {
                free(criticalblock78.super_unique_lock._M_device);
              }
              tVar38.__d.__r = local_88.__d.__r;
              criticalblock78.super_unique_lock._9_7_ = criticalblock77.super_unique_lock._9_7_;
              criticalblock78.super_unique_lock._M_owns = criticalblock77.super_unique_lock._M_owns;
              criticalblock78.super_unique_lock._M_device =
                   (mutex_type *)criticalblock77.super_unique_lock._M_device;
              local_228.__data.__lock = local_b0.__data.__lock;
              local_b0.__data.__lock = 0;
              local_228._8_8_ = local_b0._8_8_;
              local_228.__data.__kind._0_2_ = local_b0.__data.__kind._0_2_;
              local_228.__data.__list.__prev = local_b0.__data.__list.__prev;
              local_228.__data.__list.__next = local_b0.__data.__list.__next;
              if (bVar18 != false) {
                std::
                _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::~_Hashtable(&local_338);
              }
              NetGroupManager::GetGroup
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&criticalblock77,
                         this->m_netgroupman,(CNetAddr *)&criticalblock78);
              cVar29 = std::
                       _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::_Identity<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ::find(&outbound_ipv46_peer_netgroups._M_t,
                              (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                              &criticalblock77);
              if (criticalblock77.super_unique_lock._M_device != (mutex_type *)0x0) {
                operator_delete(criticalblock77.super_unique_lock._M_device,
                                CONCAT44(local_b0.__data.__count,local_b0.__data.__lock) -
                                (long)criticalblock77.super_unique_lock._M_device);
              }
              bVar18 = true;
              if ((_Rb_tree_header *)cVar29._M_node ==
                  &outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header)
              goto LAB_001a7893;
            }
LAB_001a78b7:
            if (0x10 < (uint)local_228.__data.__lock) {
              free(criticalblock78.super_unique_lock._M_device);
            }
            local_434 = local_434 + 1;
          } while (bVar18);
LAB_001a7bde:
          bVar17 = CNetAddr::IsValid((CNetAddr *)&local_f8.indirect_contents);
          iVar22 = 0;
          if (bVar17) {
            if (bVar20) {
              rel_time = RandomMixin<FastRandomContext>::
                         rand_uniform_duration<std::chrono::_V2::steady_clock>
                                   (&rng.super_RandomMixin<FastRandomContext>,(duration)0x3b9aca00);
              bVar17 = CThreadInterrupt::sleep_for(this_00,rel_time);
              iVar22 = 1;
              if (!bVar17) goto LAB_001a7e05;
              pLVar27 = LogInstance();
              bVar17 = BCLog::Logger::WillLogCategoryLevel(pLVar27,NET,Debug);
              if (bVar17) {
                CService::ToStringAddrPort_abi_cxx11_
                          ((string *)&criticalblock77,(CService *)&local_f8.indirect_contents);
                logging_function_08._M_str = "ThreadOpenConnections";
                logging_function_08._M_len = 0x15;
                source_file_08._M_str =
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
                ;
                source_file_08._M_len = 0x57;
                LogPrintFormatInternal<std::__cxx11::string>
                          (logging_function_08,source_file_08,0xaf4,NET,Debug,
                           (ConstevalFormatString<1U>)0x7d283f,(string *)&criticalblock77);
                if ((__native_type *)criticalblock77.super_unique_lock._M_device != &local_b0) {
                  operator_delete(criticalblock77.super_unique_lock._M_device,
                                  CONCAT44(local_b0.__data.__count,local_b0.__data.__lock) + 1);
                }
              }
            }
            if (preferred_net.super__Optional_base<Network,_true,_true>._M_payload.
                super__Optional_payload_base<Network>._M_engaged == true) {
              pLVar27 = LogInstance();
              bVar17 = BCLog::Logger::WillLogCategoryLevel(pLVar27,NET,Debug);
              if (bVar17) {
                CService::ToStringAddrPort_abi_cxx11_
                          ((string *)&criticalblock77,(CService *)&local_f8.indirect_contents);
                GetNetworkName_abi_cxx11_
                          ((string *)&criticalblock78,
                           preferred_net.super__Optional_base<Network,_true,_true>._M_payload.
                           super__Optional_payload_base<Network>._M_payload._M_value);
                logging_function_09._M_str = "ThreadOpenConnections";
                logging_function_09._M_len = 0x15;
                source_file_09._M_str =
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
                ;
                source_file_09._M_len = 0x57;
                LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                          (logging_function_09,source_file_09,0xaf7,NET,Debug,
                           (ConstevalFormatString<2U>)0x7d285f,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &criticalblock77,(string *)&criticalblock78);
                if ((__native_type *)criticalblock78.super_unique_lock._M_device != &local_228) {
                  operator_delete(criticalblock78.super_unique_lock._M_device,
                                  CONCAT44(local_228.__data.__count,local_228.__data.__lock) + 1);
                }
                if ((__native_type *)criticalblock77.super_unique_lock._M_device != &local_b0) {
                  operator_delete(criticalblock77.super_unique_lock._M_device,
                                  CONCAT44(local_b0.__data.__count,local_b0.__data.__lock) + 1);
                }
              }
            }
            iVar43 = this->m_max_automatic_connections;
            if (2 < iVar43) {
              iVar43 = 3;
            }
            iVar22 = 0;
            OpenNetworkConnection
                      (this,(CAddress *)&local_f8.indirect_contents,
                       iVar43 + -1 <=
                       local_400 +
                       (int)outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,&local_288,(char *)0x0,local_438,
                       (bool)((byte)(((uint)(this->nLocalServices)._M_i & (uint)p_Stack_c8) >> 0xb)
                             & 1));
          }
LAB_001a7e05:
          std::
          _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable(&reachable_nets._M_h);
        }
        else {
          if (local_3d8 < lVar26) {
            uVar24 = FastRandomContext::rand64(&rng);
            dVar11 = MakeExponentiallyDistributed(uVar24);
            local_3d8 = lVar26 + (long)ROUND(dVar11 * 120000000.0 + 0.5);
            local_438 = FEELER;
            bVar20 = true;
            goto LAB_001a727d;
          }
          iVar22 = 10;
          if ((((uVar36 == 8) && (this->m_max_outbound_full_relay == 8)) && (local_3e0 < lVar26)) &&
             (bVar20 = MaybePickPreferredNetwork(this,&preferred_net), bVar20)) {
            mVar31 = RandomMixin<FastRandomContext>::rand_exp_duration
                               (&rng.super_RandomMixin<FastRandomContext>,(microseconds)0x11e1a300);
            local_3e0 = mVar31.__r + lVar26;
            bVar20 = false;
            local_438 = OUTBOUND_FULL_RELAY;
            goto LAB_001a727d;
          }
        }
        std::
        _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::_Identity<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::~_Rb_tree(&outbound_ipv46_peer_netgroups._M_t);
        if (0x10 < (uint)local_e8._M_allocated_capacity._0_4_) {
          free(local_f8.indirect_contents.indirect);
        }
        std::
        _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable(&fixed_seed_networks._M_h);
      }
      if (local_288.fHaveGrant == true) {
        CSemaphore::post(local_288.sem);
      }
    } while ((iVar22 == 0) || (iVar22 == 10));
  }
  else {
    SVar3 = (this->nLocalServices)._M_i;
    uVar37 = 0;
    while( true ) {
      pcVar4 = (pointer)pbVar35->_M_string_length;
      for (pcVar39 = (pbVar35->_M_dataplus)._M_p; pcVar39 != pcVar4; pcVar39 = pcVar39 + 0x20) {
        CService::CService((CService *)&local_1c8.indirect_contents);
        prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                  ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&criticalblock77,
                   (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_1c8.indirect_contents)
        ;
        local_b0._8_8_ = local_1b0;
        local_b0.__data.__kind._0_2_ = local_1a8;
        local_b0.__data.__list.__prev = (__pthread_internal_list *)0x5f5e100;
        local_b0.__data.__list.__next = (__pthread_internal_list *)0x0;
        if (0x10 < local_1b8) {
          free(local_1c8.indirect_contents.indirect);
          local_1c8.indirect_contents.indirect = (char *)0x0;
        }
        local_f8.indirect_contents.indirect = (char *)0x0;
        local_f8._8_8_ = local_f8._8_8_ & 0xffffffffffffff00;
        OpenNetworkConnection
                  (this,(CAddress *)&criticalblock77,false,
                   (CSemaphoreGrant *)&local_f8.indirect_contents,*(char **)pcVar39,MANUAL,
                   (bool)((byte)(SVar3 >> 0xb) & 1));
        if (local_f8.direct[8] == '\x01') {
          CSemaphore::post((CSemaphore *)local_f8.indirect_contents.indirect);
        }
        if (uVar37 != 0) {
          uVar33 = 0;
          do {
            bVar14 = CThreadInterrupt::sleep_for(&this->interruptNet,(duration)0x1dcd6500);
            if (!bVar14) {
              if (0x10 < (uint)local_b0.__data.__lock) {
                free(criticalblock77.super_unique_lock._M_device);
              }
              goto LAB_001a6342;
            }
          } while ((uVar33 < 9) && (uVar33 = uVar33 + 1, uVar33 < uVar37));
        }
        if (0x10 < (uint)local_b0.__data.__lock) {
          free(criticalblock77.super_unique_lock._M_device);
        }
      }
      bVar14 = CThreadInterrupt::sleep_for(&this->interruptNet,(duration)0x1dcd6500);
      if (!bVar14) break;
      PerformReconnections(this);
      uVar37 = uVar37 + 1;
    }
  }
LAB_001a6342:
  ChaCha20::~ChaCha20(&rng.rng);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CConnman::ThreadOpenConnections(const std::vector<std::string> connect, Span<const std::string> seed_nodes)
{
    AssertLockNotHeld(m_unused_i2p_sessions_mutex);
    AssertLockNotHeld(m_reconnections_mutex);
    FastRandomContext rng;
    // Connect to specific addresses
    if (!connect.empty())
    {
        // Attempt v2 connection if we support v2 - we'll reconnect with v1 if our
        // peer doesn't support it or immediately disconnects us for another reason.
        const bool use_v2transport(GetLocalServices() & NODE_P2P_V2);
        for (int64_t nLoop = 0;; nLoop++)
        {
            for (const std::string& strAddr : connect)
            {
                CAddress addr(CService(), NODE_NONE);
                OpenNetworkConnection(addr, false, {}, strAddr.c_str(), ConnectionType::MANUAL, /*use_v2transport=*/use_v2transport);
                for (int i = 0; i < 10 && i < nLoop; i++)
                {
                    if (!interruptNet.sleep_for(std::chrono::milliseconds(500)))
                        return;
                }
            }
            if (!interruptNet.sleep_for(std::chrono::milliseconds(500)))
                return;
            PerformReconnections();
        }
    }

    // Initiate network connections
    auto start = GetTime<std::chrono::microseconds>();

    // Minimum time before next feeler connection (in microseconds).
    auto next_feeler = start + rng.rand_exp_duration(FEELER_INTERVAL);
    auto next_extra_block_relay = start + rng.rand_exp_duration(EXTRA_BLOCK_RELAY_ONLY_PEER_INTERVAL);
    auto next_extra_network_peer{start + rng.rand_exp_duration(EXTRA_NETWORK_PEER_INTERVAL)};
    const bool dnsseed = gArgs.GetBoolArg("-dnsseed", DEFAULT_DNSSEED);
    bool add_fixed_seeds = gArgs.GetBoolArg("-fixedseeds", DEFAULT_FIXEDSEEDS);
    const bool use_seednodes{gArgs.IsArgSet("-seednode")};

    auto seed_node_timer = NodeClock::now();
    bool add_addr_fetch{addrman.Size() == 0 && !seed_nodes.empty()};
    constexpr std::chrono::seconds ADD_NEXT_SEEDNODE = 10s;

    if (!add_fixed_seeds) {
        LogPrintf("Fixed seeds are disabled\n");
    }

    while (!interruptNet)
    {
        if (add_addr_fetch) {
            add_addr_fetch = false;
            const auto& seed{SpanPopBack(seed_nodes)};
            AddAddrFetch(seed);

            if (addrman.Size() == 0) {
                LogInfo("Empty addrman, adding seednode (%s) to addrfetch\n", seed);
            } else {
                LogInfo("Couldn't connect to peers from addrman after %d seconds. Adding seednode (%s) to addrfetch\n", ADD_NEXT_SEEDNODE.count(), seed);
            }
        }

        ProcessAddrFetch();

        if (!interruptNet.sleep_for(std::chrono::milliseconds(500)))
            return;

        PerformReconnections();

        CSemaphoreGrant grant(*semOutbound);
        if (interruptNet)
            return;

        const std::unordered_set<Network> fixed_seed_networks{GetReachableEmptyNetworks()};
        if (add_fixed_seeds && !fixed_seed_networks.empty()) {
            // When the node starts with an empty peers.dat, there are a few other sources of peers before
            // we fallback on to fixed seeds: -dnsseed, -seednode, -addnode
            // If none of those are available, we fallback on to fixed seeds immediately, else we allow
            // 60 seconds for any of those sources to populate addrman.
            bool add_fixed_seeds_now = false;
            // It is cheapest to check if enough time has passed first.
            if (GetTime<std::chrono::seconds>() > start + std::chrono::minutes{1}) {
                add_fixed_seeds_now = true;
                LogPrintf("Adding fixed seeds as 60 seconds have passed and addrman is empty for at least one reachable network\n");
            }

            // Perform cheap checks before locking a mutex.
            else if (!dnsseed && !use_seednodes) {
                LOCK(m_added_nodes_mutex);
                if (m_added_node_params.empty()) {
                    add_fixed_seeds_now = true;
                    LogPrintf("Adding fixed seeds as -dnsseed=0 (or IPv4/IPv6 connections are disabled via -onlynet) and neither -addnode nor -seednode are provided\n");
                }
            }

            if (add_fixed_seeds_now) {
                std::vector<CAddress> seed_addrs{ConvertSeeds(m_params.FixedSeeds())};
                // We will not make outgoing connections to peers that are unreachable
                // (e.g. because of -onlynet configuration).
                // Therefore, we do not add them to addrman in the first place.
                // In case previously unreachable networks become reachable
                // (e.g. in case of -onlynet changes by the user), fixed seeds will
                // be loaded only for networks for which we have no addresses.
                seed_addrs.erase(std::remove_if(seed_addrs.begin(), seed_addrs.end(),
                                                [&fixed_seed_networks](const CAddress& addr) { return fixed_seed_networks.count(addr.GetNetwork()) == 0; }),
                                 seed_addrs.end());
                CNetAddr local;
                local.SetInternal("fixedseeds");
                addrman.Add(seed_addrs, local);
                add_fixed_seeds = false;
                LogPrintf("Added %d fixed seeds from reachable networks.\n", seed_addrs.size());
            }
        }

        //
        // Choose an address to connect to based on most recently seen
        //
        CAddress addrConnect;

        // Only connect out to one peer per ipv4/ipv6 network group (/16 for IPv4).
        int nOutboundFullRelay = 0;
        int nOutboundBlockRelay = 0;
        int outbound_privacy_network_peers = 0;
        std::set<std::vector<unsigned char>> outbound_ipv46_peer_netgroups;

        {
            LOCK(m_nodes_mutex);
            for (const CNode* pnode : m_nodes) {
                if (pnode->IsFullOutboundConn()) nOutboundFullRelay++;
                if (pnode->IsBlockOnlyConn()) nOutboundBlockRelay++;

                // Make sure our persistent outbound slots to ipv4/ipv6 peers belong to different netgroups.
                switch (pnode->m_conn_type) {
                    // We currently don't take inbound connections into account. Since they are
                    // free to make, an attacker could make them to prevent us from connecting to
                    // certain peers.
                    case ConnectionType::INBOUND:
                    // Short-lived outbound connections should not affect how we select outbound
                    // peers from addrman.
                    case ConnectionType::ADDR_FETCH:
                    case ConnectionType::FEELER:
                        break;
                    case ConnectionType::MANUAL:
                    case ConnectionType::OUTBOUND_FULL_RELAY:
                    case ConnectionType::BLOCK_RELAY:
                        const CAddress address{pnode->addr};
                        if (address.IsTor() || address.IsI2P() || address.IsCJDNS()) {
                            // Since our addrman-groups for these networks are
                            // random, without relation to the route we
                            // take to connect to these peers or to the
                            // difficulty in obtaining addresses with diverse
                            // groups, we don't worry about diversity with
                            // respect to our addrman groups when connecting to
                            // these networks.
                            ++outbound_privacy_network_peers;
                        } else {
                            outbound_ipv46_peer_netgroups.insert(m_netgroupman.GetGroup(address));
                        }
                } // no default case, so the compiler can warn about missing cases
            }
        }

        if (!seed_nodes.empty() && nOutboundFullRelay < SEED_OUTBOUND_CONNECTION_THRESHOLD) {
            if (NodeClock::now() > seed_node_timer + ADD_NEXT_SEEDNODE) {
                seed_node_timer = NodeClock::now();
                add_addr_fetch = true;
            }
        }

        ConnectionType conn_type = ConnectionType::OUTBOUND_FULL_RELAY;
        auto now = GetTime<std::chrono::microseconds>();
        bool anchor = false;
        bool fFeeler = false;
        std::optional<Network> preferred_net;

        // Determine what type of connection to open. Opening
        // BLOCK_RELAY connections to addresses from anchors.dat gets the highest
        // priority. Then we open OUTBOUND_FULL_RELAY priority until we
        // meet our full-relay capacity. Then we open BLOCK_RELAY connection
        // until we hit our block-relay-only peer limit.
        // GetTryNewOutboundPeer() gets set when a stale tip is detected, so we
        // try opening an additional OUTBOUND_FULL_RELAY connection. If none of
        // these conditions are met, check to see if it's time to try an extra
        // block-relay-only peer (to confirm our tip is current, see below) or the next_feeler
        // timer to decide if we should open a FEELER.

        if (!m_anchors.empty() && (nOutboundBlockRelay < m_max_outbound_block_relay)) {
            conn_type = ConnectionType::BLOCK_RELAY;
            anchor = true;
        } else if (nOutboundFullRelay < m_max_outbound_full_relay) {
            // OUTBOUND_FULL_RELAY
        } else if (nOutboundBlockRelay < m_max_outbound_block_relay) {
            conn_type = ConnectionType::BLOCK_RELAY;
        } else if (GetTryNewOutboundPeer()) {
            // OUTBOUND_FULL_RELAY
        } else if (now > next_extra_block_relay && m_start_extra_block_relay_peers) {
            // Periodically connect to a peer (using regular outbound selection
            // methodology from addrman) and stay connected long enough to sync
            // headers, but not much else.
            //
            // Then disconnect the peer, if we haven't learned anything new.
            //
            // The idea is to make eclipse attacks very difficult to pull off,
            // because every few minutes we're finding a new peer to learn headers
            // from.
            //
            // This is similar to the logic for trying extra outbound (full-relay)
            // peers, except:
            // - we do this all the time on an exponential timer, rather than just when
            //   our tip is stale
            // - we potentially disconnect our next-youngest block-relay-only peer, if our
            //   newest block-relay-only peer delivers a block more recently.
            //   See the eviction logic in net_processing.cpp.
            //
            // Because we can promote these connections to block-relay-only
            // connections, they do not get their own ConnectionType enum
            // (similar to how we deal with extra outbound peers).
            next_extra_block_relay = now + rng.rand_exp_duration(EXTRA_BLOCK_RELAY_ONLY_PEER_INTERVAL);
            conn_type = ConnectionType::BLOCK_RELAY;
        } else if (now > next_feeler) {
            next_feeler = now + rng.rand_exp_duration(FEELER_INTERVAL);
            conn_type = ConnectionType::FEELER;
            fFeeler = true;
        } else if (nOutboundFullRelay == m_max_outbound_full_relay &&
                   m_max_outbound_full_relay == MAX_OUTBOUND_FULL_RELAY_CONNECTIONS &&
                   now > next_extra_network_peer &&
                   MaybePickPreferredNetwork(preferred_net)) {
            // Full outbound connection management: Attempt to get at least one
            // outbound peer from each reachable network by making extra connections
            // and then protecting "only" peers from a network during outbound eviction.
            // This is not attempted if the user changed -maxconnections to a value
            // so low that less than MAX_OUTBOUND_FULL_RELAY_CONNECTIONS are made,
            // to prevent interactions with otherwise protected outbound peers.
            next_extra_network_peer = now + rng.rand_exp_duration(EXTRA_NETWORK_PEER_INTERVAL);
        } else {
            // skip to next iteration of while loop
            continue;
        }

        addrman.ResolveCollisions();

        const auto current_time{NodeClock::now()};
        int nTries = 0;
        const auto reachable_nets{g_reachable_nets.All()};

        while (!interruptNet)
        {
            if (anchor && !m_anchors.empty()) {
                const CAddress addr = m_anchors.back();
                m_anchors.pop_back();
                if (!addr.IsValid() || IsLocal(addr) || !g_reachable_nets.Contains(addr) ||
                    !m_msgproc->HasAllDesirableServiceFlags(addr.nServices) ||
                    outbound_ipv46_peer_netgroups.count(m_netgroupman.GetGroup(addr))) continue;
                addrConnect = addr;
                LogDebug(BCLog::NET, "Trying to make an anchor connection to %s\n", addrConnect.ToStringAddrPort());
                break;
            }

            // If we didn't find an appropriate destination after trying 100 addresses fetched from addrman,
            // stop this loop, and let the outer loop run again (which sleeps, adds seed nodes, recalculates
            // already-connected network ranges, ...) before trying new addrman addresses.
            nTries++;
            if (nTries > 100)
                break;

            CAddress addr;
            NodeSeconds addr_last_try{0s};

            if (fFeeler) {
                // First, try to get a tried table collision address. This returns
                // an empty (invalid) address if there are no collisions to try.
                std::tie(addr, addr_last_try) = addrman.SelectTriedCollision();

                if (!addr.IsValid()) {
                    // No tried table collisions. Select a new table address
                    // for our feeler.
                    std::tie(addr, addr_last_try) = addrman.Select(true, reachable_nets);
                } else if (AlreadyConnectedToAddress(addr)) {
                    // If test-before-evict logic would have us connect to a
                    // peer that we're already connected to, just mark that
                    // address as Good(). We won't be able to initiate the
                    // connection anyway, so this avoids inadvertently evicting
                    // a currently-connected peer.
                    addrman.Good(addr);
                    // Select a new table address for our feeler instead.
                    std::tie(addr, addr_last_try) = addrman.Select(true, reachable_nets);
                }
            } else {
                // Not a feeler
                // If preferred_net has a value set, pick an extra outbound
                // peer from that network. The eviction logic in net_processing
                // ensures that a peer from another network will be evicted.
                std::tie(addr, addr_last_try) = preferred_net.has_value()
                    ? addrman.Select(false, {*preferred_net})
                    : addrman.Select(false, reachable_nets);
            }

            // Require outbound IPv4/IPv6 connections, other than feelers, to be to distinct network groups
            if (!fFeeler && outbound_ipv46_peer_netgroups.count(m_netgroupman.GetGroup(addr))) {
                continue;
            }

            // if we selected an invalid or local address, restart
            if (!addr.IsValid() || IsLocal(addr)) {
                break;
            }

            if (!g_reachable_nets.Contains(addr)) {
                continue;
            }

            // only consider very recently tried nodes after 30 failed attempts
            if (current_time - addr_last_try < 10min && nTries < 30) {
                continue;
            }

            // for non-feelers, require all the services we'll want,
            // for feelers, only require they be a full node (only because most
            // SPV clients don't have a good address DB available)
            if (!fFeeler && !m_msgproc->HasAllDesirableServiceFlags(addr.nServices)) {
                continue;
            } else if (fFeeler && !MayHaveUsefulAddressDB(addr.nServices)) {
                continue;
            }

            // Do not connect to bad ports, unless 50 invalid addresses have been selected already.
            if (nTries < 50 && (addr.IsIPv4() || addr.IsIPv6()) && IsBadPort(addr.GetPort())) {
                continue;
            }

            // Do not make automatic outbound connections to addnode peers, to
            // not use our limited outbound slots for them and to ensure
            // addnode connections benefit from their intended protections.
            if (AddedNodesContain(addr)) {
                LogPrintLevel(BCLog::NET, BCLog::Level::Debug, "Not making automatic %s%s connection to %s peer selected for manual (addnode) connection%s\n",
                              preferred_net.has_value() ? "network-specific " : "",
                              ConnectionTypeAsString(conn_type), GetNetworkName(addr.GetNetwork()),
                              fLogIPs ? strprintf(": %s", addr.ToStringAddrPort()) : "");
                continue;
            }

            addrConnect = addr;
            break;
        }

        if (addrConnect.IsValid()) {
            if (fFeeler) {
                // Add small amount of random noise before connection to avoid synchronization.
                if (!interruptNet.sleep_for(rng.rand_uniform_duration<CThreadInterrupt::Clock>(FEELER_SLEEP_WINDOW))) {
                    return;
                }
                LogDebug(BCLog::NET, "Making feeler connection to %s\n", addrConnect.ToStringAddrPort());
            }

            if (preferred_net != std::nullopt) LogDebug(BCLog::NET, "Making network specific connection to %s on %s.\n", addrConnect.ToStringAddrPort(), GetNetworkName(preferred_net.value()));

            // Record addrman failure attempts when node has at least 2 persistent outbound connections to peers with
            // different netgroups in ipv4/ipv6 networks + all peers in Tor/I2P/CJDNS networks.
            // Don't record addrman failure attempts when node is offline. This can be identified since all local
            // network connections (if any) belong in the same netgroup, and the size of `outbound_ipv46_peer_netgroups` would only be 1.
            const bool count_failures{((int)outbound_ipv46_peer_netgroups.size() + outbound_privacy_network_peers) >= std::min(m_max_automatic_connections - 1, 2)};
            // Use BIP324 transport when both us and them have NODE_V2_P2P set.
            const bool use_v2transport(addrConnect.nServices & GetLocalServices() & NODE_P2P_V2);
            OpenNetworkConnection(addrConnect, count_failures, std::move(grant), /*strDest=*/nullptr, conn_type, use_v2transport);
        }
    }
}